

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool isip(char *domain)

{
  int iVar1;
  undefined1 local_2c [8];
  in6_addr addr6;
  in_addr addr;
  char *domain_local;
  
  unique0x10000063 = domain;
  iVar1 = inet_pton(2,domain,(void *)((long)&addr6.__in6_u + 8));
  if ((iVar1 == 0) && (iVar1 = inet_pton(10,stack0xffffffffffffffe8,local_2c), iVar1 == 0)) {
    return false;
  }
  return true;
}

Assistant:

static bool isip(const char *domain)
{
  struct in_addr addr;
#ifdef ENABLE_IPV6
  struct in6_addr addr6;
#endif

  if(Curl_inet_pton(AF_INET, domain, &addr)
#ifdef ENABLE_IPV6
     || Curl_inet_pton(AF_INET6, domain, &addr6)
#endif
    ) {
    /* domain name given as IP address */
    return TRUE;
  }

  return FALSE;
}